

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O3

void setcharorrange(uchar **pp,uchar *charset)

{
  byte bVar1;
  byte *pbVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  
  pbVar2 = *pp;
  *pp = pbVar2 + 1;
  bVar4 = *pbVar2;
  charset[bVar4] = '\x01';
  if (((((byte)(bVar4 + 0xbf) < 0x1a) || ((byte)(bVar4 - 0x30) < 10)) ||
      ((byte)(bVar4 + 0x9f) < 0x1a)) && (pbVar2[1] == 0x2d)) {
    cVar5 = '\x03';
    if (0x19 < (byte)(bVar4 + 0x9f)) {
      cVar5 = (byte)(bVar4 - 0x30) < 10;
    }
    cVar3 = '\x02';
    if (0x19 < (byte)(bVar4 + 0xbf)) {
      cVar3 = cVar5;
    }
    bVar1 = pbVar2[2];
    if (bVar1 == 0x5c) {
      bVar1 = pbVar2[3];
      pbVar2 = pbVar2 + 4;
    }
    else {
      pbVar2 = pbVar2 + 3;
    }
    if (bVar4 <= bVar1) {
      cVar5 = '\x02';
      if ((0x19 < (byte)(bVar1 + 0xbf)) && (cVar5 = '\x03', 0x19 < (byte)(bVar1 + 0x9f))) {
        cVar5 = (byte)(bVar1 - 0x30) < 10;
      }
      if (cVar5 == cVar3) {
        if (bVar4 != bVar1) {
          bVar4 = bVar4 + 1;
          do {
            cVar5 = '\x02';
            if ((0x19 < (byte)(bVar4 + 0xbf)) && (cVar5 = '\x03', 0x19 < (byte)(bVar4 + 0x9f))) {
              cVar5 = (byte)(bVar4 - 0x30) < 10;
            }
            if (cVar5 == cVar3) {
              charset[bVar4] = '\x01';
            }
            bVar4 = bVar4 + 1;
          } while ((byte)(bVar4 - bVar1) != '\x01');
        }
        *pp = pbVar2;
        return;
      }
    }
  }
  return;
}

Assistant:

static void setcharorrange(unsigned char **pp, unsigned char *charset)
{
  unsigned char *p = (*pp)++;
  unsigned char c = *p++;

  charset[c] = 1;
  if(ISALNUM(c) && *p++ == '-') {
    char_class cc = charclass(c);
    unsigned char endrange = *p++;

    if(endrange == '\\')
      endrange = *p++;
    if(endrange >= c && charclass(endrange) == cc) {
      while(c++ != endrange)
        if(charclass(c) == cc)  /* Chars in class may be not consecutive. */
          charset[c] = 1;
      *pp = p;
    }
  }
}